

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SMBusSimulationDataGenerator::OutputProcessCallPMBusRevision(SMBusSimulationDataGenerator *this)

{
  bool is_ack;
  char cVar1;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,0x98,true);
  OutputStart(this);
  OutputByte(this,0x87,true);
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,'\x11',is_ack);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'\x17',false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputProcessCallPMBusRevision()
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( PMBUS_REVISION ) ];
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x11, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}